

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_test.cpp
# Opt level: O2

void test_ptr<booster::clone_ptr<int>>(void)

{
  char cVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  clone_ptr<int> y;
  clone_ptr<int> x;
  string local_1e8 [32];
  archive a;
  ostringstream oss;
  
  cppcms::archive::archive(&a);
  x.ptr_ = (int *)operator_new(4);
  *x.ptr_ = 0xf;
  y.ptr_ = (int *)0x0;
  cppcms::operator&(&a,&x);
  cppcms::archive::mode(&a,1);
  cppcms::operator&(&a,&y);
  if ((x.ptr_ == y.ptr_) || (*x.ptr_ != *y.ptr_)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x7a);
    std::operator<<(poVar2," *x==*y && x.get()!=y.get()");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1e8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar1 = cppcms::archive::eof();
  if (cVar1 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x7b);
    std::operator<<(poVar2," a.eof()");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1e8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::clone_ptr<int>::~clone_ptr(&y);
  booster::clone_ptr<int>::~clone_ptr(&x);
  cppcms::archive::~archive(&a);
  cppcms::archive::archive(&a);
  x.ptr_ = (int *)operator_new(4);
  *x.ptr_ = 0xf;
  y.ptr_ = (int *)0x0;
  cppcms::archive_traits<booster::clone_ptr<int>,_void>::save(&x,&a);
  cppcms::archive::mode(&a,1);
  cppcms::archive_traits<booster::clone_ptr<int>,_void>::load(&y,&a);
  if ((x.ptr_ == y.ptr_) || (*x.ptr_ != *y.ptr_)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x85);
    std::operator<<(poVar2," *x==*y && x.get()!=y.get()");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1e8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar1 = cppcms::archive::eof();
  if (cVar1 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x86);
    std::operator<<(poVar2," a.eof()");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1e8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::clone_ptr<int>::~clone_ptr(&y);
  booster::clone_ptr<int>::~clone_ptr(&x);
  cppcms::archive::~archive(&a);
  cppcms::archive::archive(&a);
  x.ptr_ = (int *)0x0;
  y.ptr_ = (int *)operator_new(4);
  *y.ptr_ = 0xf;
  cppcms::operator&(&a,&x);
  cppcms::archive::mode(&a,1);
  cppcms::operator&(&a,&y);
  if (y.ptr_ != (int *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x8f);
    std::operator<<(poVar2," y.get()==0");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1e8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar1 = cppcms::archive::eof();
  if (cVar1 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x90);
    std::operator<<(poVar2," a.eof()");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1e8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::clone_ptr<int>::~clone_ptr(&y);
  booster::clone_ptr<int>::~clone_ptr(&x);
  cppcms::archive::~archive(&a);
  cppcms::archive::archive(&a);
  x.ptr_ = (int *)0x0;
  y.ptr_ = (int *)operator_new(4);
  *y.ptr_ = 0xf;
  cppcms::archive_traits<booster::clone_ptr<int>,_void>::save(&x,&a);
  cppcms::archive::mode(&a,1);
  cppcms::archive_traits<booster::clone_ptr<int>,_void>::load(&y,&a);
  if (y.ptr_ == (int *)0x0) {
    cVar1 = cppcms::archive::eof();
    if (cVar1 != '\0') {
      booster::clone_ptr<int>::~clone_ptr(&y);
      booster::clone_ptr<int>::~clone_ptr(&x);
      cppcms::archive::~archive(&a);
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x9a);
    std::operator<<(poVar2," a.eof()");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1e8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"Error ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x99);
  std::operator<<(poVar2," y.get()==0");
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar3,local_1e8);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_ptr()
{
	{
		cppcms::archive a;
		Pointer x(new int(15)),y;
		a & x;
		a.mode(cppcms::archive::load_from_archive);
		a & y;
		TEST(*x==*y && x.get()!=y.get());
		TEST(a.eof());

	}
	{
		cppcms::archive a;
		Pointer const x(new int(15));
		Pointer y;
		a << x;
		a.mode(cppcms::archive::load_from_archive);
		a >> y;
		TEST(*x==*y && x.get()!=y.get());
		TEST(a.eof());

	}
	{
		cppcms::archive a;
		Pointer x,y(new int(15));
		a & x;
		a.mode(cppcms::archive::load_from_archive);
		a & y;
		TEST(y.get()==0);
		TEST(a.eof());
	}
	{
		cppcms::archive a;
		Pointer const x;
		Pointer y(new int(15));
		a << x;
		a.mode(cppcms::archive::load_from_archive);
		a >> y;
		TEST(y.get()==0);
		TEST(a.eof());
	}

}